

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

bool flatbuffers::tests::TestValue<bool>(char *json,char *type_name,char *decls)

{
  bool bVar1;
  voffset_t field;
  char *pcVar2;
  uint8_t *puVar3;
  Table *this;
  char *local_bf8;
  char *local_bc8;
  Table *root;
  string print_back;
  undefined1 local_b88 [5];
  bool done;
  bool schema_done;
  allocator<char> local_b61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  undefined1 local_ae0 [8];
  string schema;
  bool check_default;
  IDLOptions local_ab0;
  undefined1 local_7a0 [8];
  Parser parser;
  char *decls_local;
  char *type_name_local;
  char *json_local;
  
  parser._1912_8_ = decls;
  IDLOptions::IDLOptions(&local_ab0);
  Parser::Parser((Parser *)local_7a0,&local_ab0);
  IDLOptions::~IDLOptions(&local_ab0);
  FlatBufferBuilderImpl<false>::ForceDefaults
            ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8),true);
  schema.field_2._M_local_buf[0xb] = -(json == (char *)0x0) & 1;
  if (schema.field_2._M_local_buf[0xb] != 0) {
    parser.known_attributes_._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  }
  if (parser._1912_8_ == 0) {
    local_bc8 = "";
  }
  else {
    local_bc8 = (char *)parser._1912_8_;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b60,local_bc8,&local_b61);
  std::operator+(&local_b40,&local_b60,"\n");
  std::operator+(&local_b20,&local_b40,"table X { y:");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b88,type_name,
             (allocator<char> *)(print_back.field_2._M_local_buf + 0xf));
  std::operator+(&local_b00,&local_b20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ae0,
                 &local_b00,"; } root_type X;");
  std::__cxx11::string::~string((string *)&local_b00);
  std::__cxx11::string::~string((string *)local_b88);
  std::allocator<char>::~allocator((allocator<char> *)(print_back.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_b20);
  std::__cxx11::string::~string((string *)&local_b40);
  std::__cxx11::string::~string((string *)&local_b60);
  std::allocator<char>::~allocator(&local_b61);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  print_back.field_2._M_local_buf[0xe] =
       Parser::Parse((Parser *)local_7a0,pcVar2,(char **)0x0,(char *)0x0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar2,"","\'parser.error_.c_str()\' != \'\"\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
            ,0x1dd,"");
  TestEq<bool,bool>((bool)(print_back.field_2._M_local_buf[0xe] & 1),true,
                    "\'schema_done\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1de,"");
  local_bf8 = json;
  if ((schema.field_2._M_local_buf[0xb] & 1U) != 0) {
    local_bf8 = "{}";
  }
  print_back.field_2._M_local_buf[0xd] =
       Parser::Parse((Parser *)local_7a0,local_bf8,(char **)0x0,(char *)0x0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar2,"","\'parser.error_.c_str()\' != \'\"\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
            ,0x1e1,"");
  TestEq<bool,bool>((bool)(print_back.field_2._M_local_buf[0xd] & 1),true,"\'done\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1e2,"");
  std::__cxx11::string::string((string *)&root);
  parser.known_attributes_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0xffffffff;
  puVar3 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
  pcVar2 = GenText((Parser *)local_7a0,puVar3,(string *)&root);
  TestEq<bool,bool>(true,pcVar2 == (char *)0x0,
                    "\'nullptr\' != \'GenText(parser, parser.builder_.GetBufferPointer(), &print_back)\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1e7,"");
  if ((schema.field_2._M_local_buf[0xb] & 1U) != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_7a0,pcVar2,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar1,true,"\'parser.Parse(print_back.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                      ,0x1e9,"");
  }
  puVar3 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
  this = GetRoot<flatbuffers::Table>(puVar3);
  field = FieldIndexToOffset(0);
  bVar1 = Table::GetField<bool>(this,field,false);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::~string((string *)local_ae0);
  Parser::~Parser((Parser *)local_7a0);
  return bVar1;
}

Assistant:

T TestValue(const char *json, const char *type_name,
            const char *decls = nullptr) {
  flatbuffers::Parser parser;
  parser.builder_.ForceDefaults(true);  // return defaults
  auto check_default = json ? false : true;
  if (check_default) { parser.opts.output_default_scalars_in_json = true; }
  // Simple schema.
  std::string schema = std::string(decls ? decls : "") + "\n" +
                       "table X { y:" + std::string(type_name) +
                       "; } root_type X;";
  auto schema_done = parser.Parse(schema.c_str());
  TEST_EQ_STR(parser.error_.c_str(), "");
  TEST_EQ(schema_done, true);

  auto done = parser.Parse(check_default ? "{}" : json);
  TEST_EQ_STR(parser.error_.c_str(), "");
  TEST_EQ(done, true);

  // Check with print.
  std::string print_back;
  parser.opts.indent_step = -1;
  TEST_NULL(GenText(parser, parser.builder_.GetBufferPointer(), &print_back));
  // restore value from its default
  if (check_default) { TEST_EQ(parser.Parse(print_back.c_str()), true); }

  auto root = flatbuffers::GetRoot<flatbuffers::Table>(
      parser.builder_.GetBufferPointer());
  return root->GetField<T>(flatbuffers::FieldIndexToOffset(0), 0);
}